

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeStamp::checkRigidBodies(MoleculeStamp *this)

{
  pointer pcVar1;
  __normal_iterator<OpenMD::RigidBodyStamp_**,_std::vector<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>_>
  _Var2;
  pointer ppRVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  OpenMDException *pOVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  vector<int,_std::allocator<int>_> rigidAtoms;
  ostringstream oss;
  string local_1e0;
  vector<int,_std::allocator<int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1e0._M_dataplus._M_p = (pointer)0x0;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::RigidBodyStamp**,std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::RigidBodyStamp*const>>
                    ((this->rigidBodyStamps_).
                     super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->rigidBodyStamps_).
                     super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current !=
      (this->rigidBodyStamps_).
      super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error in Molecule ",0x12);
    pcVar1 = (this->Name).data_._M_dataplus._M_p;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":rigidBody[",0xb);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] is missing\n",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar5,&local_1e0);
    __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  ppRVar3 = (this->rigidBodyStamps_).
            super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->rigidBodyStamps_).
      super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppRVar3) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1c0,
                 (vector<int,_std::allocator<int>_> *)
                 (*(long *)((long)ppRVar3 + (lVar8 >> 0x1d)) + 0x70));
      local_1e0._M_string_length =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_1e0);
      if (_Var4._M_current !=
          local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar1 = (this->Name).data_._M_dataplus._M_p;
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        pOVar5 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar5,&local_1e0);
        __cxa_throw(pOVar5,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar7 = uVar7 + 1;
      ppRVar3 = (this->rigidBodyStamps_).
                super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x100000000;
    } while (uVar7 < (ulong)((long)(this->rigidBodyStamps_).
                                   super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkRigidBodies() {
    std::ostringstream oss;
    std::vector<RigidBodyStamp*>::iterator ri =
        std::find(rigidBodyStamps_.begin(), rigidBodyStamps_.end(),
                  static_cast<RigidBodyStamp*>(NULL));
    if (ri != rigidBodyStamps_.end()) {
      oss << "Error in Molecule " << getName() << ":rigidBody["
          << ri - rigidBodyStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }

    for (std::size_t i = 0; i < getNRigidBodies(); ++i) {
      RigidBodyStamp* rbStamp     = getRigidBodyStamp(i);
      std::vector<int> rigidAtoms = rbStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(rigidAtoms.begin(), rigidAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      if (j != rigidAtoms.end()) {
        oss << "Error in Molecule " << getName();
        throw OpenMDException(oss.str());
      }
    }
  }